

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O3

LayoutDirection __thiscall QTextBlock::textDirection(QTextBlock *this)

{
  char16_t *pcVar1;
  FragmentMap *this_00;
  char16_t *pcVar2;
  QArrayData *pQVar3;
  QTextDocumentPrivate *pQVar4;
  QTextFragmentData *pQVar5;
  LayoutDirection LVar6;
  int iVar7;
  uint n;
  quint32 qVar8;
  uint uVar9;
  char16_t *pcVar10;
  ulong uVar11;
  wchar32 wVar12;
  QTextDocumentPrivate *pQVar13;
  long in_FS_OFFSET;
  char16_t *local_68;
  QTextFormat local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blockFormat((QTextBlock *)&local_48);
  LVar6 = QTextFormat::intProperty(&local_48,0x801);
  QTextFormat::~QTextFormat(&local_48);
  if (LVar6 == LayoutDirectionAuto) {
    pQVar13 = this->p;
    LVar6 = *(uint *)&pQVar13->defaultTextOption >> 0xe & (LayoutDirectionAuto|RightToLeft);
    if (LVar6 == LayoutDirectionAuto) {
      pQVar3 = &((pQVar13->text).d.d)->super_QArrayData;
      local_68 = (pQVar13->text).d.ptr;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar13 = this->p;
      }
      iVar7 = position(this);
      this_00 = &pQVar13->fragments;
      LVar6 = LeftToRight;
      n = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,iVar7,0);
      pQVar4 = this->p;
      qVar8 = 0;
      if (pQVar4 != (QTextDocumentPrivate *)0x0) {
        qVar8 = 0;
        if ((ulong)(uint)this->n != 0) {
          qVar8 = (pQVar4->blocks).data.field_0.fragments[(uint)this->n].super_QFragment<3>.
                  size_array[0];
        }
      }
      uVar9 = QFragmentMapData<QTextFragmentData>::findNode
                        (&(pQVar4->fragments).data,qVar8 + iVar7 + -1,0);
      if ((pQVar13 != pQVar4) || (n != uVar9)) {
        if (local_68 == (char16_t *)0x0) {
          local_68 = (char16_t *)&QString::_empty;
        }
        do {
          pQVar5 = (this_00->data).field_0.fragments;
          uVar11 = (ulong)pQVar5[n].super_QFragment<1>.size_array[0];
          if (uVar11 != 0) {
            pcVar10 = local_68 + pQVar5[n].stringPosition;
            pcVar2 = pcVar10 + uVar11;
            do {
              wVar12 = (wchar32)(ushort)*pcVar10;
              if ((((wVar12 & 0xfc00U) == 0xd800) && (pcVar1 = pcVar10 + 1, pcVar1 < pcVar2)) &&
                 (((ushort)*pcVar1 & 0xfc00) == 0xdc00)) {
                wVar12 = (uint)(ushort)*pcVar10 * 0x400 + (uint)(ushort)*pcVar1 + L'\xfca02400';
                pcVar10 = pcVar1;
              }
              iVar7 = QChar::direction(wVar12);
              if (iVar7 == 0) {
                LVar6 = LeftToRight;
                goto LAB_0052a011;
              }
              if ((iVar7 == 1) || (iVar7 == 0xd)) {
                LVar6 = RightToLeft;
                goto LAB_0052a011;
              }
              pcVar10 = pcVar10 + 1;
            } while (pcVar10 < pcVar2);
          }
          n = QFragmentMapData<QTextFragmentData>::next(&this_00->data,n);
        } while ((pQVar13 != pQVar4) || (n != uVar9));
      }
LAB_0052a011:
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return LVar6;
}

Assistant:

Qt::LayoutDirection QTextBlock::textDirection() const
{
    Qt::LayoutDirection dir = blockFormat().layoutDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    dir = p->defaultTextOption.textDirection();
    if (dir != Qt::LayoutDirectionAuto)
        return dir;

    const QString buffer = p->buffer();

    const int pos = position();
    QTextDocumentPrivate::FragmentIterator it = p->find(pos);
    QTextDocumentPrivate::FragmentIterator end = p->find(pos + length() - 1); // -1 to omit the block separator char
    for (; it != end; ++it) {
        const QTextFragmentData * const frag = it.value();
        const QChar *p = buffer.constData() + frag->stringPosition;
        const QChar * const end = p + frag->size_array[0];
        while (p < end) {
            uint ucs4 = p->unicode();
            if (QChar::isHighSurrogate(ucs4) && p + 1 < end) {
                ushort low = p[1].unicode();
                if (QChar::isLowSurrogate(low)) {
                    ucs4 = QChar::surrogateToUcs4(ucs4, low);
                    ++p;
                }
            }
            switch (QChar::direction(ucs4)) {
            case QChar::DirL:
                return Qt::LeftToRight;
            case QChar::DirR:
            case QChar::DirAL:
                return Qt::RightToLeft;
            default:
                break;
            }
            ++p;
        }
    }
    return Qt::LeftToRight;
}